

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O3

CURLcode easysrc_add(curl_slist **plist,char *line)

{
  CURLcode CVar1;
  curl_slist *pcVar2;
  
  pcVar2 = (curl_slist *)curl_slist_append(*plist);
  if (pcVar2 == (curl_slist *)0x0) {
    easysrc_free();
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *plist = pcVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode easysrc_add(struct curl_slist **plist, const char *line)
{
  CURLcode ret = CURLE_OK;
  struct curl_slist *list =
    curl_slist_append(*plist, line);
  if(!list) {
    easysrc_free();
    ret = CURLE_OUT_OF_MEMORY;
  }
  else
    *plist = list;
  return ret;
}